

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

int deflateStateCheck(z_streamp strm)

{
  internal_state *piVar1;
  deflate_state *s;
  z_streamp strm_local;
  
  if (((strm == (z_streamp)0x0) || (strm->zalloc == (alloc_func)0x0)) ||
     (strm->zfree == (free_func)0x0)) {
    strm_local._4_4_ = 1;
  }
  else {
    piVar1 = strm->state;
    if (((piVar1 == (internal_state *)0x0) || (piVar1->strm != strm)) ||
       (((piVar1->status != 0x2a && ((piVar1->status != 0x39 && (piVar1->status != 0x45)))) &&
        ((piVar1->status != 0x49 &&
         ((((piVar1->status != 0x5b && (piVar1->status != 0x67)) && (piVar1->status != 0x71)) &&
          (piVar1->status != 0x29a)))))))) {
      strm_local._4_4_ = 1;
    }
    else {
      strm_local._4_4_ = 0;
    }
  }
  return strm_local._4_4_;
}

Assistant:

local int deflateStateCheck (strm)
    z_streamp strm;
{
    deflate_state *s;
    if (strm == Z_NULL ||
        strm->zalloc == (alloc_func)0 || strm->zfree == (free_func)0)
        return 1;
    s = strm->state;
    if (s == Z_NULL || s->strm != strm || (s->status != INIT_STATE &&
#ifdef GZIP
                                           s->status != GZIP_STATE &&
#endif
                                           s->status != EXTRA_STATE &&
                                           s->status != NAME_STATE &&
                                           s->status != COMMENT_STATE &&
                                           s->status != HCRC_STATE &&
                                           s->status != BUSY_STATE &&
                                           s->status != FINISH_STATE))
        return 1;
    return 0;
}